

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O3

Real __thiscall PeleLM::getCellsCount(PeleLM *this)

{
  EBCellFlagFab *this_00;
  int iVar1;
  int iVar2;
  int iVar3;
  FabType FVar4;
  long lVar5;
  FabArray<amrex::EBCellFlagFab> *pFVar6;
  FabArray<amrex::FArrayBox> *this_01;
  int iVar7;
  pointer *ppbVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  void *__s;
  long lVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  bool bVar17;
  double dVar18;
  MFIter mfi;
  Array4<const_double> vfrac;
  MultiFab MFTemp;
  Real local_2f8;
  Box local_2dc;
  long local_2c0;
  long local_2b8;
  int local_2ac;
  Array4<double> local_2a8;
  PeleLM *local_268;
  long local_260;
  long local_258;
  undefined1 local_250 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_240;
  int local_228;
  Vector<int,_std::allocator<int>_> *local_210;
  Array4<const_double> local_1f0;
  FabArray<amrex::FArrayBox> local_1b0;
  
  local_250._0_8_ =
       (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
  local_250._8_8_ = (FabArrayBase *)0x0;
  vStack_240.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_240.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_240.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2a8.p = (double *)&PTR__FabFactory_00712918;
  local_268 = this;
  amrex::MultiFab::MultiFab
            ((MultiFab *)&local_1b0,&(this->super_NavierStokesBase).super_AmrLevel.grids,
             &(this->super_NavierStokesBase).super_AmrLevel.dmap,1,0,(MFInfo *)local_250,
             (FabFactory<amrex::FArrayBox> *)&local_2a8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_240);
  amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            (&local_1b0,1.0,0,local_1b0.super_FabArrayBase.n_comp,
             &local_1b0.super_FabArrayBase.n_grow);
  amrex::MFIter::MFIter((MFIter *)local_250,&local_1b0.super_FabArrayBase,true);
  if ((int)vStack_240.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage < local_228) {
    do {
      amrex::MFIter::tilebox(&local_2dc,(MFIter *)local_250);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_2a8,&local_1b0,(MFIter *)local_250);
      lVar5 = __dynamic_cast((local_268->super_NavierStokesBase).super_AmrLevel.m_factory._M_t.
                             super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                             .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                             _M_head_impl,&amrex::FabFactory<amrex::FArrayBox>::typeinfo,
                             &amrex::EBFArrayBoxFactory::typeinfo,0);
      if (lVar5 == 0) {
        __cxa_bad_cast();
      }
      pFVar6 = amrex::EBDataCollection::getMultiEBCellFlagFab(*(EBDataCollection **)(lVar5 + 0xd8));
      ppbVar8 = &vStack_240.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if (local_210 != (Vector<int,_std::allocator<int>_> *)0x0) {
        ppbVar8 = (pointer *)
                  ((local_210->super_vector<int,_std::allocator<int>_>).
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start +
                  (int)vStack_240.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      this_00 = (pFVar6->m_fabs_v).
                super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>.
                _M_impl.super__Vector_impl_data._M_start[*(int *)ppbVar8];
      FVar4 = amrex::EBCellFlagFab::getType(this_00,&local_2dc);
      iVar3 = local_2dc.bigend.vect[2];
      iVar7 = local_2dc.bigend.vect[0];
      if (FVar4 == covered) {
        if (local_2dc.smallend.vect[2] <= local_2dc.bigend.vect[2]) {
          local_258 = local_2a8.kstride;
          local_2c0 = (long)local_2dc.smallend.vect[1];
          iVar2 = local_2dc.smallend.vect[0];
          lVar5 = (long)local_2dc.smallend.vect[0];
          uVar9 = local_2dc.bigend.vect[0] - local_2dc.smallend.vect[0];
          local_2b8 = CONCAT44(local_2b8._4_4_,local_2dc.bigend.vect[1]);
          lVar14 = local_2a8.jstride * 8;
          local_260 = (local_2c0 - local_2a8.begin.y) * lVar14 + (long)local_2a8.begin.x * -8 +
                      (long)local_2a8.p;
          local_2ac = (local_2dc.bigend.vect[1] - local_2dc.smallend.vect[1]) + 1;
          iVar16 = local_2dc.smallend.vect[2] - local_2a8.begin.z;
          iVar1 = local_2dc.smallend.vect[2];
          do {
            if ((int)local_2c0 <= (int)local_2b8) {
              __s = (void *)(local_260 + (iVar16 * local_258 + lVar5) * 8);
              iVar15 = local_2ac;
              do {
                if (iVar2 <= iVar7) {
                  memset(__s,0,(ulong)uVar9 * 8 + 8);
                }
                __s = (void *)((long)__s + lVar14);
                iVar15 = iVar15 + -1;
              } while (iVar15 != 0);
            }
            iVar16 = iVar16 + 1;
            bVar17 = iVar1 != iVar3;
            iVar1 = iVar1 + 1;
          } while (bVar17);
        }
      }
      else {
        FVar4 = amrex::EBCellFlagFab::getType(this_00,&local_2dc);
        if (FVar4 != regular) {
          this_01 = &amrex::EBDataCollection::getVolFrac(*(EBDataCollection **)(lVar5 + 0xd8))->
                     super_FabArray<amrex::FArrayBox>;
          amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_1f0,this_01,(MFIter *)local_250);
          if (local_2dc.smallend.vect[2] <= local_2dc.bigend.vect[2]) {
            lVar14 = (long)local_2dc.smallend.vect[1];
            lVar5 = CONCAT44(local_1f0.jstride._4_4_,(int)local_1f0.jstride) * 8;
            local_2c0 = (lVar14 - local_2a8.begin.y) * local_2a8.jstride * 8 +
                        (long)local_2dc.smallend.vect[0] * 8 + (long)local_2a8.begin.x * -8 +
                        (long)local_2a8.p;
            local_2b8 = local_2a8.kstride * 8;
            iVar7 = local_2dc.smallend.vect[2];
            do {
              if (local_2dc.smallend.vect[1] <= local_2dc.bigend.vect[1]) {
                lVar13 = ((long)iVar7 - (long)local_2a8.begin.z) * local_2b8 + local_2c0;
                lVar12 = ((long)iVar7 - (long)local_1f0.begin.z) *
                         CONCAT44(local_1f0.kstride._4_4_,(int)local_1f0.kstride) * 8 +
                         (lVar14 - local_1f0.begin.y) * lVar5 + (long)local_2dc.smallend.vect[0] * 8
                         + (long)local_1f0.begin.x * -8 +
                         CONCAT44(local_1f0.p._4_4_,(int)local_1f0.p);
                lVar11 = lVar14;
                do {
                  if (local_2dc.smallend.vect[0] <= local_2dc.bigend.vect[0]) {
                    lVar10 = 0;
                    do {
                      *(double *)(lVar13 + lVar10 * 8) =
                           *(double *)(lVar12 + lVar10 * 8) * *(double *)(lVar13 + lVar10 * 8);
                      lVar10 = lVar10 + 1;
                    } while ((local_2dc.bigend.vect[0] - local_2dc.smallend.vect[0]) + 1 !=
                             (int)lVar10);
                  }
                  lVar11 = lVar11 + 1;
                  lVar13 = lVar13 + local_2a8.jstride * 8;
                  lVar12 = lVar12 + lVar5;
                } while (local_2dc.bigend.vect[1] + 1 != (int)lVar11);
              }
              bVar17 = iVar7 != local_2dc.bigend.vect[2];
              iVar7 = iVar7 + 1;
            } while (bVar17);
          }
        }
      }
      amrex::MFIter::operator++((MFIter *)local_250);
    } while ((int)vStack_240.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage < local_228);
  }
  amrex::MFIter::~MFIter((MFIter *)local_250);
  local_2dc.smallend.vect[0] = 0;
  local_2dc.smallend.vect[1] = 0;
  local_2dc.smallend.vect[2] = 0;
  amrex::MFIter::MFIter((MFIter *)local_250,&local_1b0.super_FabArrayBase,true);
  local_2f8 = 0.0;
  if ((int)vStack_240.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage < local_228) {
    local_2f8 = 0.0;
    do {
      amrex::MFIter::growntilebox((Box *)&local_1f0,(MFIter *)local_250,&local_2dc.smallend);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                ((Array4<const_double> *)&local_2a8,&local_1b0,(MFIter *)local_250);
      lVar5 = (long)(int)local_1f0.jstride;
      dVar18 = 0.0;
      if ((int)local_1f0.jstride <= local_1f0.kstride._4_4_) {
        lVar14 = ((long)local_1f0.p._4_4_ - (long)local_2a8.begin.y) * local_2a8.jstride * 8 +
                 (lVar5 - local_2a8.begin.z) * local_2a8.kstride * 8 + (long)(int)local_1f0.p * 8 +
                 (long)local_2a8.begin.x * -8 + (long)local_2a8.p;
        do {
          lVar11 = lVar14;
          lVar12 = (long)local_1f0.p._4_4_;
          if (local_1f0.p._4_4_ <= (int)local_1f0.kstride) {
            do {
              if ((int)local_1f0.p <= local_1f0.jstride._4_4_) {
                lVar13 = 0;
                do {
                  dVar18 = dVar18 + *(double *)(lVar11 + lVar13 * 8);
                  lVar13 = lVar13 + 1;
                } while ((local_1f0.jstride._4_4_ - (int)local_1f0.p) + 1 != (int)lVar13);
              }
              lVar12 = lVar12 + 1;
              lVar11 = lVar11 + local_2a8.jstride * 8;
            } while ((int)local_1f0.kstride + 1 != (int)lVar12);
          }
          lVar5 = lVar5 + 1;
          lVar14 = lVar14 + local_2a8.kstride * 8;
        } while (local_1f0.kstride._4_4_ + 1 != (int)lVar5);
      }
      local_2f8 = local_2f8 + dVar18;
      amrex::MFIter::operator++((MFIter *)local_250);
    } while ((int)vStack_240.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage < local_228);
  }
  amrex::MFIter::~MFIter((MFIter *)local_250);
  amrex::MultiFab::~MultiFab((MultiFab *)&local_1b0);
  return local_2f8;
}

Assistant:

Real
PeleLM::getCellsCount()
{
#ifdef AMREX_USE_EB
   MultiFab MFTemp(grids,dmap,1,0);
   MFTemp.setVal(1.0);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
   for (MFIter mfi(MFTemp,TilingIfNotGPU()); mfi.isValid(); ++mfi)
   {
      const Box& bx = mfi.tilebox();
      auto const& temp = MFTemp.array(mfi);
      auto const& ebfactory = dynamic_cast<EBFArrayBoxFactory const&>(Factory());
      auto const& flagfab = ebfactory.getMultiEBCellFlagFab()[mfi];
      auto const& flag    = flagfab.const_array();

      if (flagfab.getType(bx) == FabType::covered) {              // Covered boxes
         amrex::ParallelFor(bx, [temp]
         AMREX_GPU_DEVICE( int i, int j, int k) noexcept
         {
            temp(i,j,k) = 0.0;
         });
      } else if (flagfab.getType(bx) != FabType::regular ) {     // EB containing boxes
         auto vfrac = ebfactory.getVolFrac().const_array(mfi);
         amrex::ParallelFor(bx, [temp,vfrac]
         AMREX_GPU_DEVICE( int i, int j, int k) noexcept
         {
            temp(i,j,k) *= vfrac(i,j,k);
         });
      }
   }

   Real count = amrex::ReduceSum(MFTemp, 0, []
   AMREX_GPU_HOST_DEVICE (Box const& bx, Array4<Real const> const& dat ) noexcept -> Real
   {
      Real r = 0.0;
      AMREX_LOOP_3D(bx,i,j,k,
      {
         r += dat(i,j,k);
      });
      return r;
   });
   ParallelDescriptor::ReduceRealSum(count);

   return count;
#else
   Real count = grids.numPts();
   return count;
#endif
}